

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::MakeCidentifier(string *__return_storage_ptr__,string *s)

{
  long lVar1;
  undefined1 *puVar2;
  size_type pos;
  string local_70 [8];
  string permited_chars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  byte local_19;
  string *local_18;
  string *s_local;
  string *str;
  
  local_19 = 0;
  local_18 = s;
  s_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  lVar1 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x91e5fb);
  if (lVar1 == 0) {
    std::operator+(&local_40,"_",__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_70,"_abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789",
             (allocator *)((long)&pos + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
  while( true ) {
    lVar1 = std::__cxx11::string::find_first_not_of
                      ((string *)__return_storage_ptr__,(ulong)local_70);
    if (lVar1 == -1) break;
    puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *puVar2 = 0x5f;
  }
  local_19 = 1;
  std::__cxx11::string::~string(local_70);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::MakeCidentifier(const std::string& s)
{
  std::string str(s);
  if (str.find_first_of("0123456789") == 0)
    {
    str = "_" + str;
    }

  std::string permited_chars("_"
                             "abcdefghijklmnopqrstuvwxyz"
                             "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                             "0123456789");
  std::string::size_type pos = 0;
  while ((pos = str.find_first_not_of(permited_chars, pos)) != std::string::npos)
    {
    str[pos] = '_';
    }
  return str;
}